

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O1

int CfdAddPsbtRecord(void *handle,void *psbt_handle,int type,uint32_t index,char *key,char *value)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  CfdException *pCVar4;
  ByteData data;
  ByteData key_data;
  undefined1 local_88 [36];
  int local_64;
  ByteData local_60;
  ByteData local_48;
  
  local_64 = type;
  cfd::Initialize();
  pcVar1 = local_88 + 0x10;
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"PsbtHandle","");
  cfd::capi::CheckBuffer(psbt_handle,(string *)local_88);
  if ((pointer)local_88._0_8_ != pcVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  bVar2 = cfd::capi::IsEmptyString(key);
  if (bVar2) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x8b8;
    local_88._16_8_ = "CfdAddPsbtRecord";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"key is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. key is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (value == (char *)0x0) {
    local_88._0_8_ = "cfdcapi_psbt.cpp";
    local_88._8_4_ = 0x8be;
    local_88._16_8_ = "CfdAddPsbtRecord";
    cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"value is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. value is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)local_88,key,(allocator *)&local_60);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_88);
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    local_88._0_8_ = pcVar1;
    sVar3 = strlen(value);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,value,value + sVar3);
    cfd::core::ByteData::ByteData(&local_60,(string *)local_88);
    if ((pointer)local_88._0_8_ != pcVar1) {
      operator_delete((void *)local_88._0_8_);
    }
    if (local_64 == 1) {
      cfd::core::Psbt::SetGlobalRecord(*(Psbt **)((long)psbt_handle + 0x18),&local_48,&local_60);
    }
    else if (local_64 == 2) {
      cfd::core::Psbt::SetTxInRecord(*(Psbt **)((long)psbt_handle + 0x18),index,&local_48,&local_60)
      ;
    }
    else {
      if (local_64 != 3) {
        local_88._0_8_ = "cfdcapi_psbt.cpp";
        local_88._8_4_ = 0x8d7;
        local_88._16_8_ = "CfdAddPsbtRecord";
        cfd::core::logger::log<int&>
                  ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"type is invalid: {}",&local_64
                  );
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_88._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"Failed to parameter. type is invalid.","");
        cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_88);
        __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException
                   );
      }
      cfd::core::Psbt::SetTxOutRecord
                (*(Psbt **)((long)psbt_handle + 0x18),index,&local_48,&local_60);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_88._0_8_ = "cfdcapi_psbt.cpp";
  local_88._8_4_ = 0x8c4;
  local_88._16_8_ = "CfdAddPsbtRecord";
  cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"psbt is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Failed to handle statement. psbt is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_88);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPsbtRecord(
    void* handle, void* psbt_handle, int type, uint32_t index, const char* key,
    const char* value) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }
    if (value == nullptr) {
      warn(CFD_LOG_SOURCE, "value is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. value is null.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    ByteData key_data(key);
    ByteData data(value);
    switch (type) {
      case kCfdPsbtRecordTypeGlobal:
        psbt_obj->psbt->SetGlobalRecord(key_data, data);
        break;
      case kCfdPsbtRecordTypeInput:
        psbt_obj->psbt->SetTxInRecord(index, key_data, data);
        break;
      case kCfdPsbtRecordTypeOutput:
        psbt_obj->psbt->SetTxOutRecord(index, key_data, data);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}